

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O0

void Assimp::OpenGEX::copyVectorArray(size_t numItems,DataArrayList *vaList,aiVector3D *vectorArray)

{
  Value *next;
  size_t i;
  aiVector3D *vectorArray_local;
  DataArrayList *vaList_local;
  size_t numItems_local;
  
  vectorArray_local = (aiVector3D *)vaList;
  for (next = (Value *)0x0; next < numItems; next = (Value *)((long)&next->m_type + 1)) {
    fillVector3(vectorArray + (long)next,*(Value **)&vectorArray_local->z);
    vectorArray_local = *(aiVector3D **)&vectorArray_local[1].y;
  }
  return;
}

Assistant:

static void copyVectorArray( size_t numItems, DataArrayList *vaList, aiVector3D *vectorArray ) {
    for( size_t i = 0; i < numItems; i++ ) {
        Value *next( vaList->m_dataList );
        fillVector3( &vectorArray[ i ], next );
        vaList = vaList->m_next;
    }
}